

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int codeEqualityTerm(Parse *pParse,WhereTerm *pTerm,WhereLevel *pLevel,int iEq,int bRev,int iTarget)

{
  WhereLoop *pLoop_00;
  Vdbe *pVVar1;
  sqlite3 *db_00;
  u8 uVar2;
  int iVar3;
  int iVar4;
  InLoop *pIVar5;
  int local_a8;
  int local_a4;
  int iCol;
  int iOut;
  int iMap;
  int n;
  sqlite3 *db;
  Expr *pExpr;
  int *aiMap;
  int nEq;
  int i;
  WhereLoop *pLoop;
  InLoop *pIn;
  int local_50;
  int iTab;
  int eType;
  int iReg;
  Vdbe *v;
  Expr *pX;
  uint local_30;
  int iTarget_local;
  int bRev_local;
  int iEq_local;
  WhereLevel *pLevel_local;
  WhereTerm *pTerm_local;
  Parse *pParse_local;
  
  v = (Vdbe *)pTerm->pExpr;
  _eType = pParse->pVdbe;
  pX._4_4_ = iTarget;
  local_30 = bRev;
  iTarget_local = iEq;
  _bRev_local = pLevel;
  pLevel_local = (WhereLevel *)pTerm;
  pTerm_local = (WhereTerm *)pParse;
  if ((*(u8 *)&v->db == '5') || (*(u8 *)&v->db == '-')) {
    iTab = sqlite3ExprCodeTarget(pParse,(Expr *)v->pParse,iTarget);
  }
  else {
    iTab = iTarget;
    if (*(u8 *)&v->db == '2') {
      sqlite3VdbeAddOp2(_eType,0x4b,0,iTarget);
    }
    else {
      local_50 = 5;
      pLoop_00 = pLevel->pWLoop;
      aiMap._0_4_ = 0;
      pExpr = (Expr *)0x0;
      if ((((pLoop_00->wsFlags & 0x400) == 0) && ((pLoop_00->u).btree.pIndex != (Index *)0x0)) &&
         (((pLoop_00->u).btree.pIndex)->aSortOrder[iEq] != '\0')) {
        local_30 = (uint)((bRev != 0 ^ 0xffU) & 1);
      }
      for (aiMap._4_4_ = 0; iVar3 = iEq, aiMap._4_4_ < iEq; aiMap._4_4_ = aiMap._4_4_ + 1) {
        if ((pLoop_00->aLTerm[aiMap._4_4_] != (WhereTerm *)0x0) &&
           ((Vdbe *)pLoop_00->aLTerm[aiMap._4_4_]->pExpr == v)) {
          disableTerm(pLevel,pTerm);
          return pX._4_4_;
        }
      }
      while (aiMap._4_4_ = iVar3, aiMap._4_4_ < (int)(uint)pLoop_00->nLTerm) {
        if ((Vdbe *)pLoop_00->aLTerm[aiMap._4_4_]->pExpr == v) {
          aiMap._0_4_ = (int)aiMap + 1;
        }
        iVar3 = aiMap._4_4_ + 1;
      }
      pIn._4_4_ = 0;
      if ((((ulong)v->db & 0x100000000000) == 0) ||
         (((anon_union_8_2_a01b6dbf_for_x *)&v->nVar)->pSelect->pEList->nExpr == 1)) {
        local_50 = sqlite3FindInIndex(pParse,(Expr *)v,4,(int *)0x0,(int *)0x0,
                                      (int *)((long)&pIn + 4));
      }
      else {
        pVVar1 = (Vdbe *)pTerm->pExpr;
        if ((pVVar1->cacheCtr == 0) || (((ulong)pVVar1->db & 0x200000000000000) == 0)) {
          db_00 = pParse->db;
          v = (Vdbe *)removeUnindexableInClauseTerms(pParse,iEq,pLoop_00,(Expr *)v);
          if (db_00->mallocFailed == '\0') {
            pExpr = (Expr *)sqlite3DbMallocZero((sqlite3 *)pTerm_local->pExpr,(long)(int)aiMap << 2)
            ;
            local_50 = sqlite3FindInIndex((Parse *)pTerm_local,(Expr *)v,4,(int *)0x0,(int *)pExpr,
                                          (int *)((long)&pIn + 4));
            pVVar1->cacheCtr = pIn._4_4_;
          }
          sqlite3ExprDelete(db_00,(Expr *)v);
          v = pVVar1;
        }
        else {
          local_a4 = sqlite3ExprVectorSize((Expr *)v->pVNext);
          if (local_a4 < (int)aiMap) {
            local_a4 = (int)aiMap;
          }
          pExpr = (Expr *)sqlite3DbMallocZero((sqlite3 *)pTerm_local->pExpr,(long)local_a4 << 2);
          local_50 = sqlite3FindInIndex((Parse *)pTerm_local,(Expr *)v,4,(int *)0x0,(int *)pExpr,
                                        (int *)((long)&pIn + 4));
          v = pVVar1;
        }
      }
      if (local_50 == 4) {
        local_30 = (uint)((local_30 != 0 ^ 0xffU) & 1);
      }
      iVar3 = 0x24;
      if (local_30 != 0) {
        iVar3 = 0x20;
      }
      sqlite3VdbeAddOp2(_eType,iVar3,pIn._4_4_,0);
      pLoop_00->wsFlags = pLoop_00->wsFlags | 0x800;
      if ((_bRev_local->u).in.nIn == 0) {
        iVar3 = sqlite3VdbeMakeLabel((Parse *)pTerm_local);
        _bRev_local->addrNxt = iVar3;
      }
      if ((0 < iTarget_local) && ((pLoop_00->wsFlags & 0x100000) == 0)) {
        pLoop_00->wsFlags = pLoop_00->wsFlags | 0x40000;
      }
      iVar3 = (_bRev_local->u).in.nIn;
      (_bRev_local->u).in.nIn = (int)aiMap + (_bRev_local->u).in.nIn;
      pIVar5 = (InLoop *)
               sqlite3WhereRealloc((WhereInfo *)**(undefined8 **)&pLevel_local->iIdxCur,
                                   (_bRev_local->u).in.aInLoop,(long)(_bRev_local->u).in.nIn * 0x14)
      ;
      (_bRev_local->u).in.aInLoop = pIVar5;
      pIVar5 = (_bRev_local->u).in.aInLoop;
      if (pIVar5 == (InLoop *)0x0) {
        (_bRev_local->u).in.nIn = 0;
      }
      else {
        iCol = 0;
        pLoop = (WhereLoop *)(pIVar5 + iVar3);
        for (aiMap._4_4_ = iTarget_local; aiMap._4_4_ < (int)(uint)pLoop_00->nLTerm;
            aiMap._4_4_ = aiMap._4_4_ + 1) {
          if ((Vdbe *)pLoop_00->aLTerm[aiMap._4_4_]->pExpr == v) {
            iVar3 = (iTab + aiMap._4_4_) - iTarget_local;
            if (local_50 == 1) {
              iVar4 = sqlite3VdbeAddOp2(_eType,0x87,pIn._4_4_,iVar3);
              *(int *)((long)&pLoop->prereq + 4) = iVar4;
            }
            else {
              if (pExpr == (Expr *)0x0) {
                local_a8 = 0;
              }
              else {
                local_a8 = *(int *)(&pExpr->op + (long)iCol * 4);
                iCol = iCol + 1;
              }
              iVar4 = sqlite3VdbeAddOp3(_eType,0x5e,pIn._4_4_,local_a8,iVar3);
              *(int *)((long)&pLoop->prereq + 4) = iVar4;
            }
            sqlite3VdbeAddOp1(_eType,0x32,iVar3);
            if (aiMap._4_4_ == iTarget_local) {
              *(u32 *)&pLoop->prereq = pIn._4_4_;
              uVar2 = '\'';
              if (local_30 != 0) {
                uVar2 = '&';
              }
              pLoop->iTab = uVar2;
              if (iTarget_local < 1) {
                *(undefined4 *)((long)&pLoop->maskSelf + 4) = 0;
              }
              else {
                *(int *)&pLoop->maskSelf = iTab - aiMap._4_4_;
                *(int *)((long)&pLoop->maskSelf + 4) = aiMap._4_4_;
              }
            }
            else {
              pLoop->iTab = 0xb8;
            }
            pLoop = (WhereLoop *)&pLoop->rRun;
          }
        }
        if ((0 < iTarget_local) && ((pLoop_00->wsFlags & 0x100400) == 0)) {
          sqlite3VdbeAddOp3(_eType,0x7d,_bRev_local->iIdxCur,0,iTarget_local);
        }
      }
      sqlite3DbFree((sqlite3 *)pTerm_local->pExpr,pExpr);
    }
  }
  if (((_bRev_local->pWLoop->wsFlags & 0x200000) == 0) || ((pLevel_local->addrSkip & 0x800) == 0)) {
    disableTerm(_bRev_local,(WhereTerm *)pLevel_local);
  }
  return iTab;
}

Assistant:

static int codeEqualityTerm(
  Parse *pParse,      /* The parsing context */
  WhereTerm *pTerm,   /* The term of the WHERE clause to be coded */
  WhereLevel *pLevel, /* The level of the FROM clause we are working on */
  int iEq,            /* Index of the equality term within this level */
  int bRev,           /* True for reverse-order IN operations */
  int iTarget         /* Attempt to leave results in this register */
){
  Expr *pX = pTerm->pExpr;
  Vdbe *v = pParse->pVdbe;
  int iReg;                  /* Register holding results */

  assert( pLevel->pWLoop->aLTerm[iEq]==pTerm );
  assert( iTarget>0 );
  if( pX->op==TK_EQ || pX->op==TK_IS ){
    iReg = sqlite3ExprCodeTarget(pParse, pX->pRight, iTarget);
  }else if( pX->op==TK_ISNULL ){
    iReg = iTarget;
    sqlite3VdbeAddOp2(v, OP_Null, 0, iReg);
#ifndef SQLITE_OMIT_SUBQUERY
  }else{
    int eType = IN_INDEX_NOOP;
    int iTab;
    struct InLoop *pIn;
    WhereLoop *pLoop = pLevel->pWLoop;
    int i;
    int nEq = 0;
    int *aiMap = 0;

    if( (pLoop->wsFlags & WHERE_VIRTUALTABLE)==0
      && pLoop->u.btree.pIndex!=0
      && pLoop->u.btree.pIndex->aSortOrder[iEq]
    ){
      testcase( iEq==0 );
      testcase( bRev );
      bRev = !bRev;
    }
    assert( pX->op==TK_IN );
    iReg = iTarget;

    for(i=0; i<iEq; i++){
      if( pLoop->aLTerm[i] && pLoop->aLTerm[i]->pExpr==pX ){
        disableTerm(pLevel, pTerm);
        return iTarget;
      }
    }
    for(i=iEq;i<pLoop->nLTerm; i++){
      assert( pLoop->aLTerm[i]!=0 );
      if( pLoop->aLTerm[i]->pExpr==pX ) nEq++;
    }

    iTab = 0;
    if( !ExprUseXSelect(pX) || pX->x.pSelect->pEList->nExpr==1 ){
      eType = sqlite3FindInIndex(pParse, pX, IN_INDEX_LOOP, 0, 0, &iTab);
    }else{
      Expr *pExpr = pTerm->pExpr;
      if( pExpr->iTable==0 || !ExprHasProperty(pExpr, EP_Subrtn) ){
        sqlite3 *db = pParse->db;
        pX = removeUnindexableInClauseTerms(pParse, iEq, pLoop, pX);
        if( !db->mallocFailed ){
          aiMap = (int*)sqlite3DbMallocZero(pParse->db, sizeof(int)*nEq);
          eType = sqlite3FindInIndex(pParse, pX, IN_INDEX_LOOP, 0, aiMap,&iTab);
          pExpr->iTable = iTab;
        }
        sqlite3ExprDelete(db, pX);
      }else{
        int n = sqlite3ExprVectorSize(pX->pLeft);
        aiMap = (int*)sqlite3DbMallocZero(pParse->db, sizeof(int)*MAX(nEq,n));
        eType = sqlite3FindInIndex(pParse, pX, IN_INDEX_LOOP, 0, aiMap, &iTab);
      }
      pX = pExpr;
    }

    if( eType==IN_INDEX_INDEX_DESC ){
      testcase( bRev );
      bRev = !bRev;
    }
    sqlite3VdbeAddOp2(v, bRev ? OP_Last : OP_Rewind, iTab, 0);
    VdbeCoverageIf(v, bRev);
    VdbeCoverageIf(v, !bRev);

    assert( (pLoop->wsFlags & WHERE_MULTI_OR)==0 );
    pLoop->wsFlags |= WHERE_IN_ABLE;
    if( pLevel->u.in.nIn==0 ){
      pLevel->addrNxt = sqlite3VdbeMakeLabel(pParse);
    }
    if( iEq>0 && (pLoop->wsFlags & WHERE_IN_SEEKSCAN)==0 ){
      pLoop->wsFlags |= WHERE_IN_EARLYOUT;
    }

    i = pLevel->u.in.nIn;
    pLevel->u.in.nIn += nEq;
    pLevel->u.in.aInLoop =
       sqlite3WhereRealloc(pTerm->pWC->pWInfo,
                           pLevel->u.in.aInLoop,
                           sizeof(pLevel->u.in.aInLoop[0])*pLevel->u.in.nIn);
    pIn = pLevel->u.in.aInLoop;
    if( pIn ){
      int iMap = 0;               /* Index in aiMap[] */
      pIn += i;
      for(i=iEq;i<pLoop->nLTerm; i++){
        if( pLoop->aLTerm[i]->pExpr==pX ){
          int iOut = iReg + i - iEq;
          if( eType==IN_INDEX_ROWID ){
            pIn->addrInTop = sqlite3VdbeAddOp2(v, OP_Rowid, iTab, iOut);
          }else{
            int iCol = aiMap ? aiMap[iMap++] : 0;
            pIn->addrInTop = sqlite3VdbeAddOp3(v,OP_Column,iTab, iCol, iOut);
          }
          sqlite3VdbeAddOp1(v, OP_IsNull, iOut); VdbeCoverage(v);
          if( i==iEq ){
            pIn->iCur = iTab;
            pIn->eEndLoopOp = bRev ? OP_Prev : OP_Next;
            if( iEq>0 ){
              pIn->iBase = iReg - i;
              pIn->nPrefix = i;
            }else{
              pIn->nPrefix = 0;
            }
          }else{
            pIn->eEndLoopOp = OP_Noop;
          }
          pIn++;
        }
      }
      testcase( iEq>0
                && (pLoop->wsFlags & WHERE_IN_SEEKSCAN)==0
                && (pLoop->wsFlags & WHERE_VIRTUALTABLE)!=0 );
      if( iEq>0
       && (pLoop->wsFlags & (WHERE_IN_SEEKSCAN|WHERE_VIRTUALTABLE))==0
      ){
        sqlite3VdbeAddOp3(v, OP_SeekHit, pLevel->iIdxCur, 0, iEq);
      }
    }else{
      pLevel->u.in.nIn = 0;
    }
    sqlite3DbFree(pParse->db, aiMap);
#endif
  }

  /* As an optimization, try to disable the WHERE clause term that is
  ** driving the index as it will always be true.  The correct answer is
  ** obtained regardless, but we might get the answer with fewer CPU cycles
  ** by omitting the term.
  **
  ** But do not disable the term unless we are certain that the term is
  ** not a transitive constraint.  For an example of where that does not
  ** work, see https://sqlite.org/forum/forumpost/eb8613976a (2021-05-04)
  */
  if( (pLevel->pWLoop->wsFlags & WHERE_TRANSCONS)==0
   || (pTerm->eOperator & WO_EQUIV)==0
  ){
    disableTerm(pLevel, pTerm);
  }

  return iReg;
}